

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddOneScopeInfo
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ScopeInfo *scopeInfo,
          LocalScopeInfoId parentId)

{
  code *pcVar1;
  bool bVar2;
  LocalFunctionId LVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  BufferBuilderRelativeOffset *this_00;
  ImmutableList<Js::BufferBuilder_*> *pIVar5;
  FunctionInfo **ppFVar6;
  PropertyRecord **ppPVar7;
  undefined4 *puVar8;
  PropertyRecord *this_01;
  ScopeInfo **ppSVar9;
  BufferBuilder *value;
  Type pSVar10;
  byte local_159;
  byte local_151;
  byte local_149;
  byte local_141;
  byte local_13b;
  byte local_131;
  byte local_129;
  byte local_121;
  byte local_119;
  byte local_111;
  byte local_10b;
  LocalScopeInfoId local_e4;
  code *local_e0;
  undefined8 local_d8;
  TrackAllocData local_d0;
  BufferBuilder *local_a8;
  BufferBuilderInt32 *entry;
  PropertyId PStack_98;
  bool hasParent;
  PropertyId propertyId;
  PropertyId symPropertyId;
  SymbolInfoFlags symbolInfoFlags;
  SymbolInfo *sym;
  byte local_7d;
  int i;
  ScopeInfoFlags scopeInfoFlags;
  FunctionInfo *pFStack_78;
  uint relativeFunctionId;
  FunctionInfo *functionInfo;
  undefined8 local_68;
  TrackAllocData local_60;
  BufferBuilderRelativeOffset *local_38;
  BufferBuilderRelativeOffset *offsetToScopeInfo;
  BufferBuilderInt32 *startOfScopeInfo;
  ScopeInfo *pSStack_20;
  LocalScopeInfoId parentId_local;
  ScopeInfo *scopeInfo_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  offsetToScopeInfo = (BufferBuilderRelativeOffset *)0x0;
  startOfScopeInfo._4_4_ = parentId;
  pSStack_20 = scopeInfo;
  scopeInfo_local = (ScopeInfo *)builder;
  builder_local = (BufferBuilderList *)this;
  PrependInt32(this,builder,L"ScopeInfo symbol count",scopeInfo->symbolCount,
               (BufferBuilderInt32 **)&offsetToScopeInfo);
  pAVar4 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&BufferBuilderRelativeOffset::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
             ,0x99a);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_60);
  functionInfo = (FunctionInfo *)Memory::ArenaAllocator::Alloc;
  local_68 = 0;
  this_00 = (BufferBuilderRelativeOffset *)
            new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar4,0x3f67b0);
  BufferBuilderRelativeOffset::BufferBuilderRelativeOffset
            (this_00,L"Offset To ScopeInfo",&offsetToScopeInfo->super_BufferBuilder);
  local_38 = this_00;
  pIVar5 = regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                     ((this->scopeInfoRelativeOffsets).list,(BufferBuilder *)this_00,this->alloc);
  (this->scopeInfoRelativeOffsets).list = pIVar5;
  ppFVar6 = Memory::WriteBarrierPtr::operator_cast_to_FunctionInfo__
                      ((WriteBarrierPtr *)&pSStack_20->functionInfo);
  pFStack_78 = *ppFVar6;
  i = 0;
  if (pFStack_78 != (FunctionInfo *)0x0) {
    LVar3 = FunctionInfo::GetLocalFunctionId(pFStack_78);
    i = LVar3 - this->topFunctionId;
  }
  PrependInt32(this,(BufferBuilderList *)scopeInfo_local,L"ScopeInfo FunctionInfo relative id",i,
               (BufferBuilderInt32 **)0x0);
  local_10b = 2;
  if ((*(ushort *)&pSStack_20->field_0x10 >> 1 & 1) == 0) {
    local_10b = 0;
  }
  local_111 = 4;
  if ((*(ushort *)&pSStack_20->field_0x10 >> 2 & 1) == 0) {
    local_111 = 0;
  }
  local_119 = 8;
  if ((*(ushort *)&pSStack_20->field_0x10 >> 3 & 1) == 0) {
    local_119 = 0;
  }
  local_121 = 0x10;
  if ((*(ushort *)&pSStack_20->field_0x10 >> 5 & 1) == 0) {
    local_121 = 0;
  }
  local_129 = 0x20;
  if ((*(ushort *)&pSStack_20->field_0x10 >> 6 & 1) == 0) {
    local_129 = 0;
  }
  local_131 = 0x40;
  if ((*(ushort *)&pSStack_20->field_0x10 >> 7 & 1) == 0) {
    local_131 = 0;
  }
  local_7d = (*(ushort *)&pSStack_20->field_0x10 & 1) != 0 | local_10b | local_111 | local_119 |
             local_121 | local_129 | local_131;
  PrependByte(this,(BufferBuilderList *)scopeInfo_local,L"ScopeInfo flags",local_7d);
  PrependInt32(this,(BufferBuilderList *)scopeInfo_local,L"ScopeInfo scope type",
               pSStack_20->scopeType,(BufferBuilderInt32 **)0x0);
  PrependInt32(this,(BufferBuilderList *)scopeInfo_local,L"ScopeInfo scope id",pSStack_20->scopeId,
               (BufferBuilderInt32 **)0x0);
  if ((DAT_01ec73ca & 1) != 0) {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Adding ScopeInfo (0x%p). Flags: %u. Type: %d. ScopeId: %d. Symbol count: %u\n",
                  pSStack_20,(ulong)local_7d,(ulong)pSStack_20->scopeType,
                  (ulong)(uint)pSStack_20->scopeId,pSStack_20->symbolCount);
  }
  sym._4_4_ = 0;
  do {
    if (pSStack_20->symbolCount <= sym._4_4_) {
      ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScopeInfo__((WriteBarrierPtr *)pSStack_20)
      ;
      entry._3_1_ = *ppSVar9 != (ScopeInfo *)0x0;
      PrependBool(this,(BufferBuilderList *)scopeInfo_local,L"ScopeInfo has parent",
                  (bool)entry._3_1_);
      if ((entry._3_1_ & 1) != 0) {
        pAVar4 = &this->alloc->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_d0,(type_info *)&BufferBuilderOf<int,true>::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                   ,0x9d6);
        pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo(pAVar4,&local_d0);
        local_e0 = Memory::ArenaAllocator::Alloc;
        local_d8 = 0;
        value = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar4,0x3f67b0)
        ;
        local_e4 = InvalidLocalScopeInfoId;
        BufferBuilderOf<int,_true>::BufferBuilderOf
                  ((BufferBuilderOf<int,_true> *)value,L"ScopeInfo parent LocalId",(int *)&local_e4)
        ;
        local_a8 = value;
        pSVar10 = (Type)regex::ImmutableList<Js::BufferBuilder_*>::Prepend
                                  ((ImmutableList<Js::BufferBuilder_*> *)scopeInfo_local->scope,
                                   value,this->alloc);
        scopeInfo_local->scope = pSVar10;
        if (startOfScopeInfo._4_4_ == InvalidLocalScopeInfoId) {
          ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScopeInfo__
                              ((WriteBarrierPtr *)pSStack_20);
          startOfScopeInfo._4_4_ = GetScopeInfoId(this,*ppSVar9);
        }
        *(LocalScopeInfoId *)&local_a8->field_0x14 = startOfScopeInfo._4_4_;
      }
      return 0;
    }
    _symPropertyId = (WriteBarrierPtr *)(&pSStack_20[1].parent + (long)sym._4_4_ * 2);
    local_13b = 2;
    if (((byte)_symPropertyId[9] >> 1 & 1) == 0) {
      local_13b = 0;
    }
    local_141 = 4;
    if (((byte)_symPropertyId[9] >> 2 & 1) == 0) {
      local_141 = 0;
    }
    local_149 = 8;
    if (((byte)_symPropertyId[9] >> 3 & 1) == 0) {
      local_149 = 0;
    }
    local_151 = 0x10;
    if (((byte)_symPropertyId[9] >> 4 & 1) == 0) {
      local_151 = 0;
    }
    local_159 = 0x20;
    if (((byte)_symPropertyId[9] >> 5 & 1) == 0) {
      local_159 = 0;
    }
    propertyId._3_1_ =
         ((byte)_symPropertyId[9] & 1) != 0 | local_13b | local_141 | local_149 | local_151 |
         local_159;
    PrependByte(this,(BufferBuilderList *)scopeInfo_local,L"SymbolInfo flags",propertyId._3_1_);
    PrependByte(this,(BufferBuilderList *)scopeInfo_local,L"SymbolInfo symbol type",
                (byte)_symPropertyId[8]);
    PStack_98 = *(PropertyId *)_symPropertyId;
    if ((*(ushort *)&pSStack_20->field_0x10 >> 4 & 1) != 0) {
      ppPVar7 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__(_symPropertyId);
      if (*ppPVar7 == (PropertyRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x9c6,"(sym->name != nullptr)","sym->name != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      this_01 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                          ((WriteBarrierPtr<const_Js::PropertyRecord> *)_symPropertyId);
      PStack_98 = PropertyRecord::GetPropertyId(this_01);
    }
    entry._4_4_ = encodePossiblyBuiltInPropertyId(this,PStack_98);
    PrependInt32(this,(BufferBuilderList *)scopeInfo_local,L"SymbolInfo property id",entry._4_4_,
                 (BufferBuilderInt32 **)0x0);
    if ((DAT_01ec73ca & 1) != 0) {
      Output::Trace(ByteCodeSerializationPhase,
                    L"\t\tSymbolInfo (0x%p). Flags: %u. Type: %d. PropertyId: %u (%u)\n",
                    _symPropertyId,(ulong)propertyId._3_1_,(ulong)(byte)_symPropertyId[8],
                    (ulong)*(uint *)_symPropertyId,PStack_98);
    }
    sym._4_4_ = sym._4_4_ + 1;
  } while( true );
}

Assistant:

HRESULT AddOneScopeInfo(BufferBuilderList & builder, ScopeInfo* scopeInfo, LocalScopeInfoId parentId = InvalidLocalScopeInfoId)
    {
        BufferBuilderInt32* startOfScopeInfo = nullptr;
        PrependInt32(builder, _u("ScopeInfo symbol count"), scopeInfo->symbolCount, &startOfScopeInfo);

        BufferBuilderRelativeOffset* offsetToScopeInfo = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To ScopeInfo"), startOfScopeInfo);
        this->scopeInfoRelativeOffsets.list = this->scopeInfoRelativeOffsets.list->Prepend(offsetToScopeInfo, alloc);

        FunctionInfo* functionInfo = scopeInfo->functionInfo;
        uint relativeFunctionId = 0;
        if (functionInfo != nullptr)
        {
            relativeFunctionId = functionInfo->GetLocalFunctionId() - topFunctionId;
        }
        PrependUInt32(builder, _u("ScopeInfo FunctionInfo relative id"), relativeFunctionId);

        ScopeInfoFlags scopeInfoFlags = (ScopeInfoFlags)
            ((scopeInfo->isDynamic ? sifIsDynamic : sifNone)
                | (scopeInfo->isObject ? sifIsObject : sifNone)
                | (scopeInfo->mustInstantiate ? sifMustInstantiate : sifNone)
                | (scopeInfo->isCached ? sifIsCached : sifNone)
                | (scopeInfo->hasLocalInClosure ? sifHasLocalInClosure : sifNone)
                | (scopeInfo->isGeneratorFunctionBody ? sifIsGeneratorFunctionBody : sifNone)
                | (scopeInfo->isAsyncFunctionBody ? sifIsAsyncFunctionBody : sifNone));

        PrependByte(builder, _u("ScopeInfo flags"), scopeInfoFlags);
        PrependInt32(builder, _u("ScopeInfo scope type"), scopeInfo->scopeType);
        PrependInt32(builder, _u("ScopeInfo scope id"), scopeInfo->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Adding ScopeInfo (0x%p). Flags: %u. Type: %d. ScopeId: %d. Symbol count: %u\n"), scopeInfo, scopeInfoFlags, scopeInfo->scopeType, scopeInfo->scopeId, scopeInfo->symbolCount);

        for (int i = 0; i < scopeInfo->symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = scopeInfo->symbols + i;

            SymbolInfoFlags symbolInfoFlags = (SymbolInfoFlags)
                ((sym->hasFuncAssignment ? syifHasFuncAssignment : syifNone)
                    | (sym->isBlockVariable ? syifIsBlockVariable : syifNone)
                    | (sym->isConst ? syifIsConst : syifNone)
                    | (sym->isFuncExpr ? syifIsFuncExpr : syifNone)
                    | (sym->isModuleExportStorage ? syifIsModuleExportStorage : syifNone)
                    | (sym->isModuleImport ? syifIsModuleImport : syifNone));

            PrependByte(builder, _u("SymbolInfo flags"), symbolInfoFlags);
            PrependByte(builder, _u("SymbolInfo symbol type"), (BYTE)sym->symbolType);

            PropertyId symPropertyId = sym->propertyId;
            if (scopeInfo->areNamesCached)
            {
                Assert(sym->name != nullptr);
                symPropertyId = sym->name->GetPropertyId();
            }

            PropertyId propertyId = encodePossiblyBuiltInPropertyId(symPropertyId);
            PrependInt32(builder, _u("SymbolInfo property id"), propertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo (0x%p). Flags: %u. Type: %d. PropertyId: %u (%u)\n"), sym, symbolInfoFlags, sym->symbolType, sym->propertyId, symPropertyId);
        }

        bool hasParent = scopeInfo->parent != nullptr;
        PrependBool(builder, _u("ScopeInfo has parent"), hasParent);

        if (hasParent)
        {
            // Prepend an int32 here as a placeholder in case we need to add more bytes into builder for the parent
            auto entry = Anew(alloc, BufferBuilderInt32, _u("ScopeInfo parent LocalId"), InvalidLocalScopeInfoId);
            builder.list = builder.list->Prepend(entry, alloc);

            // If we were not passed a valid pointer id, try and look it up in the map
            if (parentId == InvalidLocalScopeInfoId)
            {
                parentId = GetScopeInfoId(scopeInfo->parent);
            }

            // Update our placeholder with the real id of the parent
            entry->value = parentId;
        }

        return S_OK;
    }